

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O0

void __thiscall
Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::PartialPivLU
          (PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,MatrixType *matrix)

{
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  long *in_RDI;
  Index in_stack_ffffffffffffffac;
  PermutationMatrix<_1,__1,_int> *in_stack_ffffffffffffffb0;
  Transpositions<_1,__1,_int> *this_01;
  long *y;
  long *in_stack_ffffffffffffffc8;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffffd0;
  MatrixType *in_stack_ffffffffffffffd8;
  
  y = in_RDI;
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x2d2487);
  this_00 = (PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
            PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x2d2496);
  Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,y);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x2d24c7);
  PermutationMatrix<-1,_-1,_int>::PermutationMatrix
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  this_01 = (Transpositions<_1,__1,_int> *)(in_RDI + 5);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x2d24ed);
  Transpositions<-1,_-1,_int>::Transpositions(this_01,in_stack_ffffffffffffffac);
  in_RDI[7] = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  compute(this_00,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

PartialPivLU<MatrixType>::PartialPivLU(const MatrixType& matrix)
  : m_lu(matrix.rows(), matrix.rows()),
    m_p(matrix.rows()),
    m_rowsTranspositions(matrix.rows()),
    m_det_p(0),
    m_isInitialized(false)
{
  compute(matrix);
}